

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O0

void VP8InitFilter(VP8EncIterator *it)

{
  long in_RDI;
  int i;
  int s;
  undefined4 local_10;
  undefined4 local_c;
  
  if (*(long *)(in_RDI + 0x140) != 0) {
    for (local_c = 0; local_c < 4; local_c = local_c + 1) {
      for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x140) + (long)local_c * 0x200 + (long)local_10 * 8) = 0;
      }
    }
    VP8SSIMDspInit();
  }
  return;
}

Assistant:

void VP8InitFilter(VP8EncIterator* const it) {
#if !defined(WEBP_REDUCE_SIZE)
  if (it->lf_stats_ != NULL) {
    int s, i;
    for (s = 0; s < NUM_MB_SEGMENTS; s++) {
      for (i = 0; i < MAX_LF_LEVELS; i++) {
        (*it->lf_stats_)[s][i] = 0;
      }
    }
    VP8SSIMDspInit();
  }
#else
  (void)it;
#endif
}